

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgenPeeps.cpp
# Opt level: O0

bool __thiscall AgenPeeps::AlwaysDependent(AgenPeeps *this,Instr *instr)

{
  bool bVar1;
  bool local_19;
  Instr *instr_local;
  AgenPeeps *this_local;
  
  bVar1 = LowererMD::IsCall(instr);
  local_19 = true;
  if ((((!bVar1) && (local_19 = true, instr->m_opcode != PUSH)) &&
      (local_19 = true, instr->m_opcode != POP)) &&
     ((local_19 = true, instr->m_opcode != DIV && (local_19 = true, instr->m_opcode != IDIV)))) {
    local_19 = instr->m_opcode == IMUL;
  }
  return local_19;
}

Assistant:

bool AgenPeeps::AlwaysDependent(IR::Instr *instr)
{
    return LowererMD::IsCall(instr) ||
        instr->m_opcode == Js::OpCode::PUSH ||
        instr->m_opcode == Js::OpCode::POP ||
        instr->m_opcode == Js::OpCode::DIV ||
        instr->m_opcode == Js::OpCode::IDIV ||
        instr->m_opcode == Js::OpCode::IMUL;
}